

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_get.c
# Opt level: O2

int buffer_bget(buffer *s,char *buf,uint len)

{
  int iVar1;
  
  if (s->p == 0) {
    if (s->n <= len) {
      iVar1 = oneread(s->op,s->fd,buf,s->n);
      return iVar1;
    }
    iVar1 = buffer_feed(s);
    if (iVar1 < 1) {
      return iVar1;
    }
  }
  iVar1 = getthis(s,buf,len);
  return iVar1;
}

Assistant:

int buffer_bget(buffer *s,char *buf,unsigned int len)
{
  int r;
 
  if (s->p > 0) return getthis(s,buf,len);
  if (s->n <= len) return oneread(s->op,s->fd,buf,s->n);
  r = buffer_feed(s); if (r <= 0) return r;
  return getthis(s,buf,len);
}